

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::HasSubstr<char[34]>
            (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,StringLike<char[34]> *substring)

{
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,*substring,&local_51);
  std::__cxx11::string::string(local_50,local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::HasSubstrMatcher<std::string>> HasSubstr(
    const internal::StringLike<T>& substring) {
  return MakePolymorphicMatcher(
      internal::HasSubstrMatcher<std::string>(std::string(substring)));
}